

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::cmDependsC(cmDependsC *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_79 [17];
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",local_79);
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalUnixMakefileGenerator3 *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_00999218;
  (this->IncludeRegexLine).regmust = (char *)0x0;
  (this->IncludeRegexLine).program = (char *)0x0;
  (this->IncludeRegexLine).progsize = 0;
  memset(&this->IncludeRegexLine,0,0x20a);
  (this->IncludeRegexScan).regmust = (char *)0x0;
  (this->IncludeRegexScan).program = (char *)0x0;
  (this->IncludeRegexScan).progsize = 0;
  memset(&this->IncludeRegexScan,0,0x20a);
  (this->IncludeRegexComplain).regmust = (char *)0x0;
  (this->IncludeRegexComplain).program = (char *)0x0;
  (this->IncludeRegexComplain).progsize = 0;
  memset(&this->IncludeRegexComplain,0,0x20a);
  (this->IncludeRegexLineString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexLineString).field_2
  ;
  (this->IncludeRegexLineString)._M_string_length = 0;
  (this->IncludeRegexLineString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexScanString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexScanString).field_2
  ;
  (this->IncludeRegexScanString)._M_string_length = 0;
  local_58 = &this->IncludeRegexLineString;
  (this->IncludeRegexScanString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexComplainString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexComplainString).field_2;
  (this->IncludeRegexComplainString)._M_string_length = 0;
  local_60 = &this->IncludeRegexScanString;
  local_68 = &this->IncludeRegexComplainString;
  (this->IncludeRegexComplainString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransformString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexTransformString).field_2;
  (this->IncludeRegexTransformString)._M_string_length = 0;
  (this->IncludeRegexTransformString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransform).regmust = (char *)0x0;
  (this->IncludeRegexTransform).program = (char *)0x0;
  (this->IncludeRegexTransform).progsize = 0;
  memset(&this->IncludeRegexTransform,0,0x20a);
  p_Var1 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ValidDeps = (DependencyMap *)0x0;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            (&this->Unscanned);
  p_Var1 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CacheFileName)._M_dataplus._M_p = (pointer)&(this->CacheFileName).field_2;
  (this->CacheFileName)._M_string_length = 0;
  (this->CacheFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmDependsC::cmDependsC() = default;